

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O1

AEStackFrame __thiscall moira::Moira::makeFrame<0ul>(Moira *this,u32 addr)

{
  ushort uVar1;
  u32 uVar2;
  u16 uVar3;
  AEStackFrame AVar4;
  
  uVar2 = (this->reg).pc;
  uVar3 = getSR(this,&(this->reg).sr);
  uVar1 = (this->queue).ird;
  AVar4.pc = uVar2;
  AVar4.sr = uVar3;
  AVar4.ird = uVar1;
  AVar4._0_8_ = CONCAT44(addr,(uint)this->fcl | uVar1 & 0xffffffe0 | (uint)(this->reg).sr.s << 2) |
                0x10;
  return AVar4;
}

Assistant:

AEStackFrame
Moira::makeFrame(u32 addr)
{
    return makeFrame <F> (addr, getPC(), getSR(), getIRD());
}